

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O3

int cfg_cmd_handle_get(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  list_entity *plVar1;
  avl_node *paVar2;
  int iVar3;
  char *arg_00;
  cfg_entry *pcVar4;
  size_t sVar5;
  cfg_named_section *pcVar6;
  list_entity *plVar7;
  avl_node *paVar8;
  avl_node *paVar9;
  int iVar10;
  char *pcVar11;
  _parsed_argument pa;
  _parsed_argument local_50;
  
  if ((arg == (char *)0x0) || (*arg == '\0')) {
    cfg_append_printable_line(log,"Section types in database:");
    plVar7 = (db->sectiontypes).list_head.next;
    if (plVar7->prev != (db->sectiontypes).list_head.prev) {
      do {
        plVar1 = plVar7->next;
        cfg_append_printable_line(log,"%s",plVar7[3].prev);
        plVar7 = plVar1;
      } while (plVar1->prev != (db->sectiontypes).list_head.prev);
      return 0;
    }
    return 0;
  }
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  iVar3 = _do_parse_arg(arg_00,&local_50,log);
  iVar10 = -1;
  if (iVar3 != 0) goto LAB_0012a9b8;
  if (local_50.entry_value == (char *)0x0) {
    if (local_50.entry_key == (char *)0x0) {
      if (local_50.section_name == (char *)0x0) {
        paVar8 = avl_find(&db->sectiontypes,local_50.section_type);
        pcVar11 = "Cannot find data for section type: %s";
        if ((paVar8 == (avl_node *)0x0) || (*(int *)&paVar8[1].key == 0)) goto LAB_0012a9ab;
        if (paVar8[1].parent[1].list.next != (list_entity *)0x0) {
          iVar10 = 0;
          cfg_append_printable_line(log,"Named sections in section type: %s");
          if ((avl_node *)((paVar8[1].parent)->list).prev != paVar8[1].left) {
            iVar10 = 0;
            paVar9 = paVar8[1].parent;
            do {
              paVar2 = (avl_node *)(paVar9->list).next;
              cfg_append_printable_line(log,"%s",paVar9[1].list.next);
              paVar9 = paVar2;
            } while ((avl_node *)(paVar2->list).prev != paVar8[1].left);
          }
          goto LAB_0012a9b8;
        }
      }
      pcVar6 = cfg_db_find_namedsection(db,local_50.section_type,local_50.section_name);
      if (pcVar6 != (cfg_named_section *)0x0) {
        iVar10 = 0;
        cfg_append_printable_line(log,"Entry keys for section \'%s\':",arg);
        plVar7 = (pcVar6->entries).list_head.next;
        if (plVar7->prev != (pcVar6->entries).list_head.prev) {
          iVar10 = 0;
          do {
            plVar1 = plVar7->next;
            cfg_append_printable_line(log,"%s",plVar7[3].prev);
            plVar7 = plVar1;
          } while (plVar1->prev != (pcVar6->entries).list_head.prev);
        }
        goto LAB_0012a9b8;
      }
      pcVar11 = "Cannot find data for section: %s";
    }
    else {
      pcVar4 = cfg_db_find_entry(db,local_50.section_type,local_50.section_name,local_50.entry_key);
      if (pcVar4 != (cfg_entry *)0x0) {
        iVar10 = 0;
        cfg_append_printable_line(log,"Key \'%s\' has value:",arg);
        pcVar11 = (pcVar4->val).value;
        if ((pcVar11 != (char *)0x0) && (pcVar11 < (pcVar4->val).value + (pcVar4->val).length)) {
          iVar10 = 0;
          do {
            cfg_append_printable_line(log,"%s",pcVar11);
            sVar5 = strlen(pcVar11);
            pcVar11 = pcVar11 + sVar5 + 1;
          } while (pcVar11 < (pcVar4->val).value + (pcVar4->val).length);
        }
        goto LAB_0012a9b8;
      }
      pcVar11 = "Cannot find data for entry: \'%s\'\n";
    }
  }
  else {
    pcVar11 = "Value is not allowed for view command: %s";
  }
LAB_0012a9ab:
  cfg_append_printable_line(log,pcVar11,arg);
LAB_0012a9b8:
  free(arg_00);
  return iVar10;
}

Assistant:

int
cfg_cmd_handle_get(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_section_type *type, *type_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;
  struct _parsed_argument pa;
  char *arg_copy, *tmp;
  int result;

  if (arg == NULL || *arg == 0) {
    cfg_append_printable_line(log, "Section types in database:");

    CFG_FOR_ALL_SECTION_TYPES(db, type, type_it) {
      cfg_append_printable_line(log, "%s", type->type);
    }
    return 0;
  }

  arg_copy = strdup(arg);
  if (!arg_copy) {
    return -1;
  }

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(arg_copy, &pa, log)) {
    goto handle_get_cleanup;
  }

  if (pa.entry_value != NULL) {
    cfg_append_printable_line(log, "Value is not allowed for view command: %s", arg);
    goto handle_get_cleanup;
  }

  if (pa.entry_key != NULL) {
    if (NULL == (entry = cfg_db_find_entry(db, pa.section_type, pa.section_name, pa.entry_key))) {
      cfg_append_printable_line(log, "Cannot find data for entry: '%s'\n", arg);
      goto handle_get_cleanup;
    }

    cfg_append_printable_line(log, "Key '%s' has value:", arg);
    strarray_for_each_element(&entry->val, tmp) {
      cfg_append_printable_line(log, "%s", tmp);
    }
    result = 0;
    goto handle_get_cleanup;
  }

  if (pa.section_name == NULL) {
    type = cfg_db_find_sectiontype(db, pa.section_type);
    if (type == NULL || type->names.count == 0) {
      cfg_append_printable_line(log, "Cannot find data for section type: %s", arg);
      goto handle_get_cleanup;
    }

    named = avl_first_element(&type->names, named, node);
    if (cfg_db_is_named_section(named)) {
      cfg_append_printable_line(log, "Named sections in section type: %s", pa.section_type);
      CFG_FOR_ALL_SECTION_NAMES(type, named, named_it) {
        cfg_append_printable_line(log, "%s", named->name);
      }
      result = 0;
      goto handle_get_cleanup;
    }
  }

  named = cfg_db_find_namedsection(db, pa.section_type, pa.section_name);
  if (named == NULL) {
    cfg_append_printable_line(log, "Cannot find data for section: %s", arg);
    goto handle_get_cleanup;
  }

  cfg_append_printable_line(log, "Entry keys for section '%s':", arg);
  CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
    cfg_append_printable_line(log, "%s", entry->name);
  }
  result = 0;

handle_get_cleanup:
  free(arg_copy);
  return result;
}